

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnicode.c
# Opt level: O2

JL_STATUS JlUnicodeValueToUtf8(uint32_t UnicodeValue,char *OutputUtf8,size_t *pNumBytesWritten)

{
  byte bVar1;
  size_t sStack_8;
  
  if (UnicodeValue == 0) {
    OutputUtf8[0] = -0x40;
    OutputUtf8[1] = -0x80;
  }
  else {
    bVar1 = (byte)UnicodeValue;
    if (UnicodeValue < 0x80) {
      *OutputUtf8 = bVar1;
      sStack_8 = 1;
      goto LAB_0010541a;
    }
    if (0x7ff < UnicodeValue) {
      if (UnicodeValue < 0x10000) {
        *OutputUtf8 = (byte)(UnicodeValue >> 0xc) | 0xe0;
        OutputUtf8[1] = (byte)(UnicodeValue >> 6) & 0x3f | 0x80;
        OutputUtf8[2] = bVar1 & 0x3f | 0x80;
        sStack_8 = 3;
      }
      else {
        if (0x10ffff < UnicodeValue) {
          return JL_STATUS_INVALID_DATA;
        }
        *OutputUtf8 = (byte)(UnicodeValue >> 0x12) | 0xf0;
        OutputUtf8[1] = (byte)(UnicodeValue >> 0xc) & 0x3f | 0x80;
        OutputUtf8[2] = (byte)(UnicodeValue >> 6) & 0x3f | 0x80;
        OutputUtf8[3] = bVar1 & 0x3f | 0x80;
        sStack_8 = 4;
      }
      goto LAB_0010541a;
    }
    *OutputUtf8 = (byte)(UnicodeValue >> 6) | 0xc0;
    OutputUtf8[1] = bVar1 & 0x3f | 0x80;
  }
  sStack_8 = 2;
LAB_0010541a:
  *pNumBytesWritten = sStack_8;
  return JL_STATUS_SUCCESS;
}

Assistant:

JL_STATUS
    JlUnicodeValueToUtf8
    (
        uint32_t        UnicodeValue,
        char*           OutputUtf8,
        size_t*         pNumBytesWritten
    )
{
    JL_STATUS jlStatus;

    if( 0 == UnicodeValue )
    {
        // Special case, When we have unicode 0 value we allow this by using outputting modified utf8 for 0 (0xc0 0x80)
        // We do not want to put a 0 directly in the string or it will be treated as a null terminator
        OutputUtf8[0] = 0xc0;
        OutputUtf8[1] = 0x80;
        *pNumBytesWritten = 2;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( UnicodeValue <= 0x7f )
    {
        OutputUtf8[0] = (uint8_t)UnicodeValue;
        *pNumBytesWritten = 1;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( UnicodeValue <=0x7ff)
    {
        OutputUtf8[0] = ((uint8_t)(UnicodeValue >> 6) & 0x1f ) | 0xc0;
        OutputUtf8[1] = ((uint8_t)(UnicodeValue     ) & 0x3f ) | 0x80;
        *pNumBytesWritten = 2;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( UnicodeValue <=0xffff)
    {
        OutputUtf8[0] = ((uint8_t)(UnicodeValue >> 12) & 0x0f ) | 0xe0;
        OutputUtf8[1] = ((uint8_t)(UnicodeValue >> 6 ) & 0x3f ) | 0x80;
        OutputUtf8[2] = ((uint8_t)(UnicodeValue      ) & 0x3f ) | 0x80;
        *pNumBytesWritten = 3;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( UnicodeValue <=0x10ffff)
    {
        OutputUtf8[0] = ((uint8_t)(UnicodeValue >> 18) & 0x07 ) | 0xf0;
        OutputUtf8[1] = ((uint8_t)(UnicodeValue >> 12) & 0x3f ) | 0x80;
        OutputUtf8[2] = ((uint8_t)(UnicodeValue >> 6 ) & 0x3f ) | 0x80;
        OutputUtf8[3] = ((uint8_t)(UnicodeValue      ) & 0x3f ) | 0x80;
        *pNumBytesWritten = 4;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        // Invalid Unicode value. (Unicode is defined from 0 - 0x10ffff)
        jlStatus = JL_STATUS_INVALID_DATA;
    }

    return jlStatus;
}